

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<int> *this;
  char *pcVar1;
  value_type vVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  ulong __n;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  reference pvVar9;
  uint *puVar10;
  char local_1a9;
  char local_f6;
  char local_f5;
  value_type local_f4;
  char c;
  char cho;
  int pc1;
  int local_e8;
  uint local_e4;
  int level;
  int pc;
  uint j;
  uint level_1;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matching;
  int iMem;
  vector<int,_std::allocator<int>_> mem;
  uint m;
  char ch;
  vector<char,_std::allocator<char>_> code;
  invalid_argument anon_var_0;
  allocator local_49;
  string local_48 [8];
  string st;
  char *dn;
  char **ppcStack_18;
  int delay_ms;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  std::ios_base::sync_with_stdio(false);
  dn._4_4_ = 0;
  if (1 < (int)argv_local) {
    pcVar1 = ppcStack_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    dn._4_4_ = std::__cxx11::stoi((string *)local_48,(size_t *)0x0,10);
    if (dn._4_4_ < 0) {
      dn._4_4_ = 0;
    }
    code.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    std::__cxx11::string::~string(local_48);
    if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0) {
      return argv_local._4_4_;
    }
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&m);
  std::vector<char,_std::allocator<char>_>::reserve((vector<char,_std::allocator<char>_> *)&m,0x400)
  ;
  while( true ) {
    iVar4 = getchar();
    mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = (char)iVar4;
    if (mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ == -1) break;
    if (mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ == '~') {
      sVar5 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&m);
      if (sVar5 != 0) {
        std::vector<char,_std::allocator<char>_>::pop_back
                  ((vector<char,_std::allocator<char>_> *)&m);
      }
    }
    else {
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&m,
                 (value_type *)
                 ((long)&mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  sVar5 = std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)&m);
  mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (uint)sVar5;
  this = (allocator<int> *)
         ((long)&matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&iMem,10000,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  __n = (ulong)(uint)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&level_1 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,__n,
             (allocator<unsigned_int> *)((long)&level_1 + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&level_1 + 3));
  j = 0;
  do {
    if ((uint)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage <= j) {
      local_e8 = 0;
      local_e4 = 0;
      while (local_e4 <
             (uint)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage) {
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffff10,
                   (int *)((long)&dn + 4));
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffff10);
        local_f4 = local_e4 + 1;
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&m,(long)(int)local_e4);
        poVar8 = std::operator<<((ostream *)&std::cout,*pvVar6);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_e4);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           (poVar8,(int)matching.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar8 = std::operator<<(poVar8," ");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&iMem,
                            (long)(int)matching.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
        std::operator<<(poVar8," ");
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&m,(long)(int)local_e4);
        switch(*pvVar6) {
        case '+':
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&iMem,
                              (long)(int)matching.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *pvVar9 = *pvVar9 + 1;
          break;
        case ',':
          std::operator>>((istream *)&std::cin,&local_f6);
          iVar4 = (int)local_f6;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&iMem,
                              (long)(int)matching.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *pvVar9 = iVar4;
          break;
        case '-':
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&iMem,
                              (long)(int)matching.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *pvVar9 = *pvVar9 + -1;
          break;
        case '.':
          puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&iMem,
                                       (long)(int)matching.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                      );
          if ((*puVar10 & 0x80) == 0) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&iMem,
                                (long)(int)matching.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_1a9 = (char)*pvVar9;
          }
          else {
            local_1a9 = '*';
          }
          local_f5 = local_1a9;
          std::operator<<((ostream *)&std::cerr,local_1a9);
          std::ostream::flush();
          std::operator<<((ostream *)&std::cout,local_f5);
          break;
        default:
          break;
        case '<':
          matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + -1;
          if ((int)matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage < 0) {
            matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 9999;
          }
          break;
        case '>':
          matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 1;
          if (9999 < (int)matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
            matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          break;
        case '[':
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&iMem,
                              (long)(int)matching.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (*pvVar9 == 0) {
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                                (long)(int)local_e4);
            local_f4 = *pvVar7 + 1;
            std::operator<<((ostream *)&std::cout,"- ");
          }
          else {
            std::operator<<((ostream *)&std::cout,"+ ");
            local_e8 = local_e8 + 1;
          }
          std::ostream::operator<<((ostream *)&std::cout,local_e8);
          break;
        case ']':
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                              (long)(int)local_e4);
          local_f4 = *pvVar7;
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_f4);
          std::operator<<(poVar8," ");
          local_e8 = local_e8 + -1;
          std::ostream::operator<<((ostream *)&std::cout,local_e8);
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        local_e4 = local_f4;
      }
      code.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
LAB_00102cc8:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&iMem);
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&m);
      return argv_local._4_4_;
    }
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&m,(ulong)j);
    vVar2 = (uint)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage;
    if (*pvVar6 == '[') {
      pc = 1;
      vVar2 = j;
      while (level = vVar2 + 1,
            (uint)level <
            (uint)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage && pc != 0) {
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&m,(ulong)(uint)level);
        vVar2 = level;
        if (*pvVar6 == '[') {
          pc = pc + 1;
        }
        else if (*pvVar6 == ']') {
          pc = pc + -1;
        }
      }
      if (pc != 0) {
        std::operator<<((ostream *)&std::cerr,"Mismatching parens.");
        argv_local._4_4_ = 1;
        code.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
        goto LAB_00102cc8;
      }
      level = vVar2;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)j);
      uVar3 = j;
      *pvVar7 = vVar2;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                          (ulong)(uint)level);
      *pvVar7 = uVar3;
    }
    else if (*pvVar6 != ']') {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)j);
      *pvVar7 = vVar2;
    }
    j = j + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  cout.sync_with_stdio(false);

  int delay_ms = 0;
  if (argc > 1) {
    char* dn = argv[1];
    string st(dn);
    try {
      delay_ms = stoi(st);
    } catch (std::invalid_argument) {
      cerr << "Invalid duration." << endl;
      return 1;
    }
    if (delay_ms < 0) delay_ms = 0;
  }

  vector<char> code;
  {
    code.reserve(1024);
    char ch;
    while ((ch = getchar()) != END) {
      if (ch == BACK) {
        if (code.size()) code.pop_back();
      } else
        code.push_back(ch);
    }
  }
  const unsigned int m = code.size();

  vector<int> mem(N);
  int iMem = 0;

  vector<unsigned int> matching(m);
  for (unsigned int i = 0; i < m; i++) {
    switch (code[i]) {
      case '[':
        {
          unsigned int level = 1;
          unsigned int j = i + 1;
          for (; j < m && level > 0; j++) {
            switch (code[j]) {
              case '[': level++; break;
              case ']': level--; break;
              default: break;
            }
          }

          if (level > 0) {
            cerr << "Mismatching parens.";
            return 1;
          }

          j--;

          //cout << i << "::" << j << "- " << endl;
          matching[i] = j;
          matching[j] = i;
        }
        break;
      case ']':
        break;
      default:
        matching[i] = m;
        break;
    }
  }

#if 0
  for (int i = 0; i < m; i++) {
    cout << "[" << i << "] = " << code[i] << " ";
    if (matching[i] == m)
      cout << endl;
    else
      cout << matching[i] << endl;
  }
#endif

  int pc = 0;
  int level = 0;
  while (pc < m) {
    std::this_thread::sleep_for(std::chrono::milliseconds(delay_ms));
    int pc1 = pc + 1;
    cout << code[pc] << " " << pc << " " << iMem << " " << mem[iMem] << " ";
    switch (code[pc]) {
      case '+':
        mem[iMem]++;
        break;
      case '-':
        mem[iMem]--;
        break;
      case '<':
        iMem--;
        if (iMem < 0) iMem = N-1;
        break;
      case '>':
        iMem++;
        if (iMem >= N) iMem = 0;
        break;
      case '[':
        if (mem[iMem] == 0) {
          pc1 = matching[pc] + 1;
          cout << "- ";
        } else {
          cout << "+ ";
          level++;
        }
        cout << level;
        break;
      case ']':
        pc1 = matching[pc];
        cout << pc1 << " ";
        level--;
        cout << level;
        break;
      case '.':
        {
          char cho = !(((char)mem[iMem]) & (char)0x80) ? (char)mem[iMem] : '*';
          cerr << cho;
          cerr.flush();
          cout << cho;
        }
        break;
      case ',':
        char c; cin >> c;
        mem[iMem] = c;
        break;
      default: break;
    }
    cout << endl;
    pc = pc1;
  }
}